

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O3

Maybe<unsigned_long> __thiscall kj::StringPtr::find(StringPtr *this,StringPtr *other)

{
  char *__haystack;
  ulong __haystacklen;
  void *pvVar1;
  size_t __needlelen;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar2;
  
  __needlelen = *(long *)(in_RDX.value + 8) - 1;
  if (__needlelen == 0) {
    *(undefined1 *)&(this->content).ptr = 1;
    (this->content).size_ = 0;
  }
  else {
    __haystacklen = (other->content).size_ - 1;
    if ((__haystacklen != 0) && (__needlelen <= __haystacklen)) {
      __haystack = (other->content).ptr;
      pvVar1 = memmem(__haystack,__haystacklen,*(void **)in_RDX,__needlelen);
      in_RDX = extraout_RDX;
      if (pvVar1 != (void *)0x0) {
        *(undefined1 *)&(this->content).ptr = 1;
        (this->content).size_ = (long)pvVar1 - (long)__haystack;
        goto LAB_0044c54a;
      }
    }
    *(undefined1 *)&(this->content).ptr = 0;
  }
LAB_0044c54a:
  MVar2.ptr.field_1.value = in_RDX.value;
  MVar2.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar2.ptr;
}

Assistant:

Maybe<size_t> StringPtr::find(const StringPtr& other) const {
  if (other.size() == 0) {
    return size_t(0);
  }
  if (size() == 0) {
    return kj::none;
  }
  if (other.size() > size()) {
    // We won't find the entirety of other if other is longer than this.
    return kj::none;
  }

#if !defined(_WIN32)
  void* found = memmem(begin(), size(), other.begin(), other.size());
  if (found == nullptr) {
    return kj::none;
  } else {
    return static_cast<char*>(found)-begin();
  }
#else
  // TODO(perf) This is O(len(this)*len(other)), which is very slow on big strings.
  //
  // On platforms that don't support memem, we should implement the Two-Way String-Matching
  // algorithm with linear performance.  The Two-Way String-Matching algorithm is described in
  // Crochemore and Perrin's CACM paper (Crochemore M., Perrin D., 1991, Two-way
  // string-matching, Journal of the ACM 38(3):651-675).
  //
  // * A scan of the original paper can be found at
  //   https://monge.univ-mlv.fr/~mac/Articles-PDF/CP-1991-jacm.pdf.
  //
  // * I find Python's implementation notes much easier to understand than the original paoer.
  //   https://github.com/python/cpython/blob/main/Objects/stringlib/stringlib_find_two_way_notes.txt
  //
  // * https://www-igm.univ-mlv.fr/~lecroq/string/node26.html#SECTION00260 has a description of
  //   the algorithm with some C code.
  for (size_t i = 0; i + other.size() <= size(); ++i) {
    if (slice(i).startsWith(other)) {
      return i;
    }
  }

  return kj::none;
#endif
}